

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_add(REF_GEOM ref_geom,REF_INT node,REF_INT type,REF_INT id,REF_DBL *param)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rsb;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS status;
  REF_INT geom;
  REF_DBL *param_local;
  int local_20;
  REF_INT id_local;
  REF_INT type_local;
  REF_INT node_local;
  REF_GEOM ref_geom_local;
  
  if ((type < 0) || (2 < type)) {
    ref_geom_local._4_4_ = 3;
  }
  else {
    _status = param;
    param_local._4_4_ = id;
    local_20 = type;
    id_local = node;
    _type_local = ref_geom;
    uVar1 = ref_geom_find(ref_geom,node,type,id,&ref_private_macro_code_rxs);
    if ((uVar1 == 0) || (uVar1 == 5)) {
      if (uVar1 == 0) {
        if (0 < local_20) {
          _type_local->param[ref_private_macro_code_rxs << 1] = *_status;
        }
        if (1 < local_20) {
          _type_local->param[ref_private_macro_code_rxs * 2 + 1] = _status[1];
        }
        ref_geom_local._4_4_ = 0;
      }
      else if ((_type_local->blank == -1) &&
              (ref_geom_local._4_4_ = ref_geom_grow(_type_local), ref_geom_local._4_4_ != 0)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x210,"ref_geom_add",(ulong)ref_geom_local._4_4_,"grow add");
      }
      else {
        ref_private_macro_code_rxs = _type_local->blank;
        _type_local->blank = _type_local->descr[ref_private_macro_code_rxs * 6 + 1];
        _type_local->descr[ref_private_macro_code_rxs * 6] = local_20;
        _type_local->descr[ref_private_macro_code_rxs * 6 + 1] = param_local._4_4_;
        _type_local->descr[ref_private_macro_code_rxs * 6 + 2] = param_local._4_4_;
        _type_local->descr[ref_private_macro_code_rxs * 6 + 3] = 0;
        _type_local->descr[ref_private_macro_code_rxs * 6 + 4] = 0;
        _type_local->descr[ref_private_macro_code_rxs * 6 + 5] = id_local;
        _type_local->param[ref_private_macro_code_rxs << 1] = 0.0;
        _type_local->param[ref_private_macro_code_rxs * 2 + 1] = 0.0;
        if (0 < local_20) {
          _type_local->param[ref_private_macro_code_rxs << 1] = *_status;
        }
        if (1 < local_20) {
          _type_local->param[ref_private_macro_code_rxs * 2 + 1] = _status[1];
        }
        ref_geom_local._4_4_ = ref_adj_add(_type_local->ref_adj,id_local,ref_private_macro_code_rxs)
        ;
        if (ref_geom_local._4_4_ == 0) {
          _type_local->n = _type_local->n + 1;
          ref_geom_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x226,"ref_geom_add",(ulong)ref_geom_local._4_4_,"register geom");
          printf("register node %d geom %d type %d id %d\n",
                 (ulong)(uint)_type_local->descr[ref_private_macro_code_rxs * 6 + 5],
                 (ulong)(uint)ref_private_macro_code_rxs,
                 (ulong)(uint)_type_local->descr[ref_private_macro_code_rxs * 6],
                 (ulong)(uint)_type_local->descr[ref_private_macro_code_rxs * 6 + 1]);
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x207,
             "ref_geom_add",(ulong)uVar1,"find failed");
      ref_geom_local._4_4_ = uVar1;
    }
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_add(REF_GEOM ref_geom, REF_INT node, REF_INT type,
                                REF_INT id, REF_DBL *param) {
  REF_INT geom;
  REF_STATUS status;

  if (type < 0 || 2 < type) return REF_INVALID;

  status = ref_geom_find(ref_geom, node, type, id, &geom);
  RXS(status, REF_NOT_FOUND, "find failed");

  if (REF_SUCCESS == status) {
    if (type > 0) ref_geom_param(ref_geom, 0, geom) = param[0];
    if (type > 1) ref_geom_param(ref_geom, 1, geom) = param[1];
    return REF_SUCCESS;
  }

  if (REF_EMPTY == ref_geom_blank(ref_geom)) {
    RSS(ref_geom_grow(ref_geom), "grow add");
  }

  geom = ref_geom_blank(ref_geom);
  ref_geom_blank(ref_geom) = ref_geom_id(ref_geom, geom);

  ref_geom_type(ref_geom, geom) = type;
  ref_geom_id(ref_geom, geom) = id;
  ref_geom_gref(ref_geom, geom) = id; /* assume same until set */
  ref_geom_jump(ref_geom, geom) = 0;
  ref_geom_degen(ref_geom, geom) = 0;
  ref_geom_node(ref_geom, geom) = node;

  ref_geom_param(ref_geom, 0, geom) = 0.0;
  ref_geom_param(ref_geom, 1, geom) = 0.0;
  if (type > 0) ref_geom_param(ref_geom, 0, geom) = param[0];
  if (type > 1) ref_geom_param(ref_geom, 1, geom) = param[1];

  RSB(ref_adj_add(ref_geom->ref_adj, node, geom), "register geom", {
    printf("register node %d geom %d type %d id %d\n",
           ref_geom_node(ref_geom, geom), geom, ref_geom_type(ref_geom, geom),
           ref_geom_id(ref_geom, geom));
  });

  ref_geom_n(ref_geom)++;

  return REF_SUCCESS;
}